

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void ptrmapPut(BtShared *pBt,Pgno key,u8 eType,Pgno parent,int *pRC)

{
  int iVar1;
  Pgno pgno;
  u32 uVar2;
  int iVar3;
  char *pcVar4;
  void *pvVar5;
  int rc;
  int offset;
  Pgno iPtrmap;
  u8 *pPtrmap;
  DbPage *pDbPage;
  int *pRC_local;
  u8 local_15;
  Pgno parent_local;
  u8 eType_local;
  BtShared *pBStack_10;
  Pgno key_local;
  BtShared *pBt_local;
  
  if (*pRC == 0) {
    pDbPage = (DbPage *)pRC;
    pRC_local._4_4_ = parent;
    local_15 = eType;
    parent_local = key;
    pBStack_10 = pBt;
    if (key == 0) {
      iVar1 = sqlite3CorruptError(0x10ddd);
      *(int *)&pDbPage->pPage = iVar1;
    }
    else {
      pgno = ptrmapPageno(pBt,key);
      iVar1 = sqlite3PagerGet(pBStack_10->pPager,pgno,(DbPage **)&pPtrmap,0);
      if (iVar1 == 0) {
        pcVar4 = (char *)sqlite3PagerGetExtra((DbPage *)pPtrmap);
        if (*pcVar4 == '\0') {
          iVar1 = ((parent_local - pgno) + -1) * 5;
          if (iVar1 < 0) {
            iVar1 = sqlite3CorruptError(0x10def);
            *(int *)&pDbPage->pPage = iVar1;
          }
          else {
            pvVar5 = sqlite3PagerGetData((DbPage *)pPtrmap);
            if ((local_15 != *(u8 *)((long)pvVar5 + (long)iVar1)) ||
               (uVar2 = sqlite3Get4byte((u8 *)((long)pvVar5 + (long)(iVar1 + 1))),
               uVar2 != pRC_local._4_4_)) {
              iVar3 = sqlite3PagerWrite((PgHdr *)pPtrmap);
              *(int *)&pDbPage->pPage = iVar3;
              if (iVar3 == 0) {
                *(u8 *)((long)pvVar5 + (long)iVar1) = local_15;
                sqlite3Put4byte((uchar *)((long)pvVar5 + (long)(iVar1 + 1)),pRC_local._4_4_);
              }
            }
          }
        }
        else {
          iVar1 = sqlite3CorruptError(0x10dea);
          *(int *)&pDbPage->pPage = iVar1;
        }
        sqlite3PagerUnref((DbPage *)pPtrmap);
      }
      else {
        *(int *)&pDbPage->pPage = iVar1;
      }
    }
  }
  return;
}

Assistant:

static void ptrmapPut(BtShared *pBt, Pgno key, u8 eType, Pgno parent, int *pRC){
  DbPage *pDbPage;  /* The pointer map page */
  u8 *pPtrmap;      /* The pointer map data */
  Pgno iPtrmap;     /* The pointer map page number */
  int offset;       /* Offset in pointer map page */
  int rc;           /* Return code from subfunctions */

  if( *pRC ) return;

  assert( sqlite3_mutex_held(pBt->mutex) );
  /* The super-journal page number must never be used as a pointer map page */
  assert( 0==PTRMAP_ISPAGE(pBt, PENDING_BYTE_PAGE(pBt)) );

  assert( pBt->autoVacuum );
  if( key==0 ){
    *pRC = SQLITE_CORRUPT_BKPT;
    return;
  }
  iPtrmap = PTRMAP_PAGENO(pBt, key);
  rc = sqlite3PagerGet(pBt->pPager, iPtrmap, &pDbPage, 0);
  if( rc!=SQLITE_OK ){
    *pRC = rc;
    return;
  }
  if( ((char*)sqlite3PagerGetExtra(pDbPage))[0]!=0 ){
    /* The first byte of the extra data is the MemPage.isInit byte.
    ** If that byte is set, it means this page is also being used
    ** as a btree page. */
    *pRC = SQLITE_CORRUPT_BKPT;
    goto ptrmap_exit;
  }
  offset = PTRMAP_PTROFFSET(iPtrmap, key);
  if( offset<0 ){
    *pRC = SQLITE_CORRUPT_BKPT;
    goto ptrmap_exit;
  }
  assert( offset <= (int)pBt->usableSize-5 );
  pPtrmap = (u8 *)sqlite3PagerGetData(pDbPage);

  if( eType!=pPtrmap[offset] || get4byte(&pPtrmap[offset+1])!=parent ){
    TRACE(("PTRMAP_UPDATE: %d->(%d,%d)\n", key, eType, parent));
    *pRC= rc = sqlite3PagerWrite(pDbPage);
    if( rc==SQLITE_OK ){
      pPtrmap[offset] = eType;
      put4byte(&pPtrmap[offset+1], parent);
    }
  }

ptrmap_exit:
  sqlite3PagerUnref(pDbPage);
}